

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_it_test.cpp
# Opt level: O1

void license::test::generate_and_verify_license
               (LCC_API_HW_IDENTIFICATION_STRATEGY strategy,string *lic_fname)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  unit_test_log_t *puVar4;
  ostream *poVar5;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_00;
  uint local_2b5c;
  uint *local_2b58;
  bool *local_2b50;
  LCC_EVENT_TYPE result;
  byte local_2b40;
  undefined8 local_2b38;
  shared_count sStack_2b30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraArgs;
  char *local_2ac0;
  char *local_2ab8;
  char *local_2ab0;
  char *local_2aa8;
  string identifier_out;
  char *local_2a80;
  char *local_2a78;
  char *local_2a70;
  char *local_2a68;
  string licLocation;
  char *local_2a10;
  char *local_2a08;
  undefined1 *local_2a00;
  undefined1 *local_29f8;
  char *local_29f0;
  char *local_29e8;
  undefined1 *local_29e0;
  undefined1 *local_29d8;
  char *local_29d0;
  char *local_29c8;
  char local_29c0 [8];
  long local_29b8;
  char local_29b0 [8];
  long local_29a8;
  char local_29a0 [8];
  long local_2998;
  LicenseInfo license;
  LicenseLocation location;
  
  puVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_2a80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2a78 = "";
  memset(&license,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&license);
  pcVar1 = license.status[0].license_reference + 0x180;
  license.status[0].license_reference[0x178] = '\0';
  license.status[0].license_reference[0x179] = '\0';
  license.status[0].license_reference[0x17a] = '\0';
  license.status[0].license_reference[0x17b] = '\0';
  license.status[0].license_reference[0x17c] = '\0';
  license.status[0].license_reference[0x17d] = '\0';
  license.status[0].license_reference[0x17e] = '\0';
  license.status[0].license_reference[0x17f] = '\0';
  license.status[0].license_reference[0x180] = '\0';
  license.status[0].license_reference._368_8_ = pcVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&license,"Before generate",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)(license.status[0].license_reference + 0x170),(string *)&location);
  pcVar2 = location.licenseData + 0xc;
  if ((char *)location._0_8_ != pcVar2) {
    operator_delete((void *)location._0_8_);
  }
  local_29a0[0] = license.status[0].license_reference[0x170];
  local_29a0[1] = license.status[0].license_reference[0x171];
  local_29a0[2] = license.status[0].license_reference[0x172];
  local_29a0[3] = license.status[0].license_reference[0x173];
  local_29a0[4] = license.status[0].license_reference[0x174];
  local_29a0[5] = license.status[0].license_reference[0x175];
  local_29a0[6] = license.status[0].license_reference[0x176];
  local_29a0[7] = license.status[0].license_reference[0x177];
  local_2998 = license.status[0].license_reference._368_8_ +
               license.status[0].license_reference._376_8_;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar4,&local_2a80,0x20);
  if ((char *)license.status[0].license_reference._368_8_ != pcVar1) {
    operator_delete((void *)license.status[0].license_reference._368_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&license);
  std::ios_base::~ios_base((ios_base *)(license.status[0].license_reference + 0x68));
  hw_identifier::HwIdentifierFacade::generate_user_pc_signature_abi_cxx11_
            (&identifier_out,(HwIdentifierFacade *)(ulong)(uint)strategy,strategy_00);
  puVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_2ab0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2aa8 = "";
  memset(&license,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&license);
  license.status[0].license_reference[0x178] = '\0';
  license.status[0].license_reference[0x179] = '\0';
  license.status[0].license_reference[0x17a] = '\0';
  license.status[0].license_reference[0x17b] = '\0';
  license.status[0].license_reference[0x17c] = '\0';
  license.status[0].license_reference[0x17d] = '\0';
  license.status[0].license_reference[0x17e] = '\0';
  license.status[0].license_reference[0x17f] = '\0';
  license.status[0].license_reference[0x180] = '\0';
  license.status[0].license_reference._368_8_ = pcVar1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&license,"After generate signature",0x18);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)(license.status[0].license_reference + 0x170),(string *)&location);
  if ((char *)location._0_8_ != pcVar2) {
    operator_delete((void *)location._0_8_);
  }
  local_29b0[0] = license.status[0].license_reference[0x170];
  local_29b0[1] = license.status[0].license_reference[0x171];
  local_29b0[2] = license.status[0].license_reference[0x172];
  local_29b0[3] = license.status[0].license_reference[0x173];
  local_29b0[4] = license.status[0].license_reference[0x174];
  local_29b0[5] = license.status[0].license_reference[0x175];
  local_29b0[6] = license.status[0].license_reference[0x176];
  local_29b0[7] = license.status[0].license_reference[0x177];
  local_29a8 = license.status[0].license_reference._368_8_ +
               license.status[0].license_reference._376_8_;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar4,&local_2ab0,0x22);
  if ((char *)license.status[0].license_reference._368_8_ != pcVar1) {
    operator_delete((void *)license.status[0].license_reference._368_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&license);
  std::ios_base::~ios_base((ios_base *)(license.status[0].license_reference + 0x68));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)std::cout,"Identifier:",0xb);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)std::cout,identifier_out._M_dataplus._M_p,
                      identifier_out._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  extraArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extraArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extraArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = license.status[0].license_reference + 8;
  license.status[0]._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&license,"-s","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extraArgs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&license);
  if ((char *)license.status[0]._0_8_ != pcVar3) {
    operator_delete((void *)license.status[0]._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&extraArgs,&identifier_out);
  puVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_2ac0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2ab8 = "";
  memset(&license,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&license);
  license.status[0].license_reference[0x178] = '\0';
  license.status[0].license_reference[0x179] = '\0';
  license.status[0].license_reference[0x17a] = '\0';
  license.status[0].license_reference[0x17b] = '\0';
  license.status[0].license_reference[0x17c] = '\0';
  license.status[0].license_reference[0x17d] = '\0';
  license.status[0].license_reference[0x17e] = '\0';
  license.status[0].license_reference[0x17f] = '\0';
  license.status[0].license_reference[0x180] = '\0';
  license.status[0].license_reference._368_8_ = pcVar1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&license,"Before generate license",0x17);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)(license.status[0].license_reference + 0x170),(string *)&location);
  if ((char *)location._0_8_ != pcVar2) {
    operator_delete((void *)location._0_8_);
  }
  local_29c0[0] = license.status[0].license_reference[0x170];
  local_29c0[1] = license.status[0].license_reference[0x171];
  local_29c0[2] = license.status[0].license_reference[0x172];
  local_29c0[3] = license.status[0].license_reference[0x173];
  local_29c0[4] = license.status[0].license_reference[0x174];
  local_29c0[5] = license.status[0].license_reference[0x175];
  local_29c0[6] = license.status[0].license_reference[0x176];
  local_29c0[7] = license.status[0].license_reference[0x177];
  local_29b8 = license.status[0].license_reference._368_8_ +
               license.status[0].license_reference._376_8_;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar4,&local_2ac0,0x27);
  if ((char *)license.status[0].license_reference._368_8_ != pcVar1) {
    operator_delete((void *)license.status[0].license_reference._368_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&license);
  std::ios_base::~ios_base((ios_base *)(license.status[0].license_reference + 0x68));
  generate_license(&licLocation,lic_fname,&extraArgs);
  memset(&location,0,0x1004);
  if (licLocation._M_string_length != 0) {
    memmove(location.licenseData,licLocation._M_dataplus._M_p,licLocation._M_string_length);
  }
  result = acquire_license((CallerInformations *)0x0,&location,&license);
  local_29d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_29c8 = "";
  local_29e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_29d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_29d0,0x2d);
  local_2b58 = &local_2b5c;
  local_2b5c = 0;
  local_2b50 = (bool *)&result;
  local_2b40 = result == LICENSE_OK;
  local_2b38 = 0;
  sStack_2b30.pi_ = (sp_counted_base *)0x0;
  local_2a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2a68 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b30);
  local_29f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_29e8 = "";
  local_2a00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_29f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_29f0,0x2e);
  local_2b50 = &license.has_expiry;
  local_2b5c = local_2b5c & 0xffffff00;
  local_2b40 = license.has_expiry ^ 1;
  local_2b38 = 0;
  sStack_2b30.pi_ = (sp_counted_base *)0x0;
  local_2a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2a68 = "";
  local_2b58 = &local_2b5c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b30);
  local_2a10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2a08 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a10,0x2f);
  local_2b50 = &license.linked_to_pc;
  local_2b5c = CONCAT31(local_2b5c._1_3_,1);
  local_2b40 = license.linked_to_pc;
  local_2b38 = 0;
  sStack_2b30.pi_ = (sp_counted_base *)0x0;
  local_2a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/functional/hw_identifier_it_test.cpp"
  ;
  local_2a68 = "";
  local_2b58 = &local_2b5c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)licLocation._M_dataplus._M_p != &licLocation.field_2) {
    operator_delete(licLocation._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&extraArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)identifier_out._M_dataplus._M_p != &identifier_out.field_2) {
    operator_delete(identifier_out._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void generate_and_verify_license(LCC_API_HW_IDENTIFICATION_STRATEGY strategy, const string& lic_fname) {
	BOOST_TEST_CHECKPOINT("Before generate");
	const string identifier_out = HwIdentifierFacade::generate_user_pc_signature(strategy);
	BOOST_TEST_CHECKPOINT("After generate signature");
	cout << "Identifier:" << identifier_out << endl;
	vector<string> extraArgs;
	extraArgs.push_back("-s");
	extraArgs.push_back(identifier_out);
	BOOST_TEST_CHECKPOINT("Before generate license");
	const string licLocation = generate_license(lic_fname, extraArgs);
	LicenseInfo license;
	LicenseLocation location = {LICENSE_PATH};
	std::copy(licLocation.begin(), licLocation.end(), location.licenseData);
	const LCC_EVENT_TYPE result = acquire_license(nullptr, &location, &license);
	BOOST_CHECK_EQUAL(result, LICENSE_OK);
	BOOST_CHECK_EQUAL(license.has_expiry, false);
	BOOST_CHECK_EQUAL(license.linked_to_pc, true);
}